

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

Token slang::parsing::Token::createMissing
                (BumpAllocator *alloc,TokenKind kind,SourceLocation location)

{
  int iVar1;
  TokenKind kind_00;
  ulong uVar2;
  Token *this;
  undefined6 in_register_00000032;
  Token TVar3;
  _Optional_payload_base<slang::TimeUnit> timeUnit;
  Token local_a0;
  undefined8 local_90;
  char *pcStack_88;
  undefined8 local_80;
  char *pcStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  char *pcStack_58;
  undefined8 local_50;
  char *pcStack_48;
  undefined8 local_40;
  char *pcStack_38;
  undefined8 local_30;
  char *pcStack_28;
  Token local_20;
  
  iVar1 = (int)CONCAT62(in_register_00000032,kind);
  switch(iVar1) {
  case 3:
    local_40 = 0;
    pcStack_38 = "";
    this = &local_a0;
    Token(this,alloc,SystemIdentifier,
          (span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0),
          (string_view)(ZEXT816(0x4b214a) << 0x40),location,Unknown);
    break;
  case 4:
switchD_002d3c16_caseD_4:
    local_a0.kind = Unknown;
    local_a0._2_1_ = 0;
    local_a0.numFlags.raw = '\0';
    local_a0.rawLen = 0;
    local_20._0_4_ = local_20._0_4_ & 0xffffff;
    local_20.rawLen = 0;
    local_a0.info = (Info *)0x4b214a;
    local_20.info = (Info *)0x0;
    init(&local_20,(EVP_PKEY_CTX *)alloc);
    local_20.info[1].rawTextPtr = (char *)0x0;
    local_20.info[1].location = (SourceLocation)((long)"with expansion:\n\t" + 0x11);
    uVar2 = CONCAT44(local_20.rawLen,local_20._0_4_);
    goto LAB_002d3ea7;
  case 5:
    local_50 = 0;
    pcStack_48 = "";
    this = &local_a0;
    Token(this,alloc,IntegerLiteral,
          (span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0),
          (string_view)(ZEXT816(0x4b214a) << 0x40),location,(SVInt *)SVInt::Zero);
    break;
  case 6:
    local_60 = 0;
    pcStack_58 = "";
    this = &local_a0;
    Token(this,alloc,IntegerBase,
          (span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0),
          (string_view)(ZEXT816(0x4b214a) << 0x40),location,Decimal,false);
    break;
  case 7:
    local_70 = 0;
    pcStack_68 = "";
    this = &local_a0;
    Token(this,alloc,UnbasedUnsizedLiteral,
          (span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0),
          (string_view)(ZEXT816(0x4b214a) << 0x40),location,(logic_t)0x80);
    break;
  case 8:
    local_80 = 0;
    pcStack_78 = "";
    timeUnit._M_payload = (_Storage<slang::TimeUnit,_true>)0x0;
    timeUnit._M_engaged = false;
    kind_00 = RealLiteral;
    goto LAB_002d3e8c;
  case 9:
    local_90 = 0;
    pcStack_88 = "";
    timeUnit._M_payload = (_Storage<slang::TimeUnit,_true>)0x0;
    timeUnit._M_engaged = true;
    kind_00 = TimeLiteral;
LAB_002d3e8c:
    this = &local_a0;
    Token(this,alloc,kind_00,(span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0),
          (string_view)(ZEXT816(0x4b214a) << 0x40),location,0.0,false,
          (optional<slang::TimeUnit>)timeUnit);
    break;
  default:
    if ((iVar1 == 0x157) || (iVar1 == 0x159)) {
      local_30 = 0;
      pcStack_28 = "";
      this = &local_a0;
      Token(this,alloc,kind,(span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0),
            (string_view)(ZEXT816(0x4b214a) << 0x40),location,Unknown);
    }
    else {
      if (iVar1 == 0x158) goto switchD_002d3c16_caseD_4;
      local_a0.kind = Unknown;
      local_a0._2_1_ = 0;
      local_a0.numFlags.raw = '\0';
      local_a0.rawLen = 0;
      this = &local_20;
      local_20._0_4_ = local_20._0_4_ & 0xffffff;
      local_20.rawLen = 0;
      local_a0.info = (Info *)0x4b214a;
      local_20.info = (Info *)0x0;
      init(this,(EVP_PKEY_CTX *)alloc);
    }
  }
  uVar2._0_2_ = this->kind;
  uVar2._2_1_ = this->field_0x2;
  uVar2._3_1_ = this->numFlags;
  uVar2._4_4_ = this->rawLen;
  local_20.info = this->info;
LAB_002d3ea7:
  TVar3._0_8_ = uVar2 | 0x10000;
  TVar3.info = local_20.info;
  return TVar3;
}

Assistant:

Token Token::createMissing(BumpAllocator& alloc, TokenKind kind, SourceLocation location) {
    Token result;
    switch (kind) {
        case TokenKind::IncludeFileName:
        case TokenKind::StringLiteral:
            result = Token(alloc, kind, {}, "", location, "");
            break;
        case TokenKind::Directive:
        case TokenKind::MacroUsage:
            result = Token(alloc, kind, {}, "", location, SyntaxKind::Unknown);
            break;
        case TokenKind::SystemIdentifier:
            result = Token(alloc, kind, {}, "", location, KnownSystemName::Unknown);
            break;
        case TokenKind::IntegerLiteral:
            result = Token(alloc, kind, {}, "", location, SVInt::Zero);
            break;
        case TokenKind::IntegerBase:
            result = Token(alloc, kind, {}, "", location, LiteralBase::Decimal, false);
            break;
        case TokenKind::UnbasedUnsizedLiteral:
            result = Token(alloc, kind, {}, "", location, logic_t::x);
            break;
        case TokenKind::RealLiteral:
            result = Token(alloc, kind, {}, "", location, 0.0, false, std::nullopt);
            break;
        case TokenKind::TimeLiteral:
            result = Token(alloc, kind, {}, "", location, 0.0, false, TimeUnit::Seconds);
            break;
        default:
            result = Token(alloc, kind, {}, "", location);
            break;
    }

    result.missing = true;
    return result;
}